

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_do_read_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  byte bVar1;
  ushort uVar2;
  png_colorp ppVar3;
  png_uint_16pp pppVar4;
  png_uint_16pp pppVar5;
  png_uint_16pp pppVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  png_uint_32 pVar10;
  png_bytep bp;
  ulong uVar11;
  png_bytep ppVar12;
  png_byte pVar13;
  sbyte sVar14;
  ushort uVar15;
  byte *pbVar16;
  ulong uVar17;
  size_t sVar18;
  uint *puVar19;
  ulong *puVar20;
  ushort uVar21;
  png_const_color_16p trans_color;
  long lVar22;
  png_byte *ppVar23;
  png_bytep ppVar24;
  ushort uVar25;
  ushort uVar26;
  png_uint_16 pVar27;
  ushort uVar28;
  uint uVar29;
  uint uVar30;
  ushort *puVar32;
  char *error_message;
  png_byte pVar33;
  byte *pbVar34;
  png_byte pVar35;
  byte bVar36;
  png_uint_16 *ppVar37;
  byte bVar38;
  char cVar39;
  png_byte pVar40;
  int iVar41;
  byte *pbVar42;
  png_bytep ppVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  ushort *puVar49;
  ushort *puVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  int local_68 [6];
  png_row_infop local_50;
  png_uint_16pp local_48;
  ulong local_40;
  png_uint_16pp local_38;
  ulong uVar31;
  
  ppVar24 = png_ptr->row_buf;
  if (ppVar24 == (png_bytep)0x0) {
    error_message = "NULL row buffer";
    goto LAB_00117ca2;
  }
  if ((png_ptr->flags & 0x4040) == 0x4000) {
    error_message = "Uninitialized row";
    goto LAB_00117ca2;
  }
  if ((png_ptr->transformations >> 0xc & 1) != 0) {
    if (row_info->color_type == '\x03') {
      ppVar3 = png_ptr->palette;
      ppVar12 = png_ptr->trans_alpha;
      uVar21 = png_ptr->num_trans;
      uVar30 = row_info->width;
      uVar17 = (ulong)uVar30;
      bVar9 = row_info->bit_depth;
      if (bVar9 < 8) {
        if (bVar9 == 4) {
          uVar11 = 0;
          if (uVar30 != 0) {
            uVar47 = uVar30 * 4 & 4;
            pbVar34 = ppVar24 + (ulong)(uVar30 - 1 >> 1) + 1;
            pbVar16 = ppVar24 + uVar17;
            uVar31 = uVar17;
            do {
              *pbVar16 = *pbVar34 >> ((byte)uVar47 & 0x1f) & 0xf;
              bVar51 = uVar47 == 4;
              uVar47 = uVar47 + 4;
              if (bVar51) {
                uVar47 = 0;
              }
              pbVar34 = pbVar34 + -(ulong)bVar51;
              pbVar16 = pbVar16 + -1;
              uVar29 = (int)uVar31 - 1;
              uVar31 = (ulong)uVar29;
              uVar11 = uVar17;
            } while (uVar29 != 0);
          }
        }
        else if (bVar9 == 2) {
          uVar11 = 0;
          if (uVar30 != 0) {
            uVar47 = ~(uVar30 * 2 + 6) & 6;
            pbVar34 = ppVar24 + (ulong)(uVar30 - 1 >> 2) + 1;
            pbVar16 = ppVar24 + uVar17;
            uVar31 = uVar17;
            do {
              *pbVar16 = *pbVar34 >> ((byte)uVar47 & 0x1f) & 3;
              bVar51 = uVar47 == 6;
              uVar47 = uVar47 + 2;
              if (bVar51) {
                uVar47 = 0;
              }
              pbVar34 = pbVar34 + -(ulong)bVar51;
              pbVar16 = pbVar16 + -1;
              uVar29 = (int)uVar31 - 1;
              uVar31 = (ulong)uVar29;
              uVar11 = uVar17;
            } while (uVar29 != 0);
          }
        }
        else {
          uVar11 = uVar17;
          if ((bVar9 == 1) && (uVar11 = 0, uVar30 != 0)) {
            uVar47 = -uVar30 & 7;
            pbVar16 = ppVar24 + (ulong)(uVar30 - 1 >> 3) + 1;
            ppVar43 = ppVar24 + uVar17;
            uVar31 = uVar17;
            do {
              *ppVar43 = (*pbVar16 >> (uVar47 & 0x1f) & 1) != 0;
              bVar51 = uVar47 == 7;
              uVar47 = uVar47 + 1;
              if (bVar51) {
                uVar47 = 0;
              }
              pbVar16 = pbVar16 + -(ulong)bVar51;
              ppVar43 = ppVar43 + -1;
              uVar29 = (int)uVar31 - 1;
              uVar31 = (ulong)uVar29;
              uVar11 = uVar17;
            } while (uVar29 != 0);
          }
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = '\b';
        row_info->rowbytes = uVar11;
      }
      else if (bVar9 != 8) goto LAB_001156fe;
      uVar47 = uVar30;
      if (uVar21 == 0) {
        uVar11 = (ulong)(uVar30 * 3);
        if (uVar30 != 0) {
          ppVar12 = ppVar24 + uVar11;
          pbVar16 = ppVar24 + uVar17;
          do {
            *ppVar12 = ppVar3[*pbVar16].blue;
            ppVar12[-1] = ppVar3[*pbVar16].green;
            ppVar12[-2] = ppVar3[*pbVar16].red;
            pbVar16 = pbVar16 + -1;
            ppVar12 = ppVar12 + -3;
            uVar30 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar30;
          } while (uVar30 != 0);
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = '\x18';
        pVar13 = '\x03';
        pVar33 = '\x02';
      }
      else {
        while (uVar47 != 0) {
          pVar13 = 0xff;
          if (ppVar24[uVar17] < uVar21) {
            pVar13 = ppVar12[ppVar24[uVar17]];
          }
          ppVar24[uVar17 * 4] = pVar13;
          ppVar24[uVar17 * 4 + -1] = ppVar3[ppVar24[uVar17]].blue;
          ppVar24[uVar17 * 4 + -2] = ppVar3[ppVar24[uVar17]].green;
          ppVar24[uVar17 * 4 + -3] = ppVar3[ppVar24[uVar17]].red;
          uVar17 = uVar17 - 1;
          uVar47 = (uint)uVar17;
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = ' ';
        uVar11 = (ulong)(uVar30 << 2);
        pVar13 = '\x04';
        pVar33 = '\x06';
      }
      row_info->rowbytes = uVar11;
      row_info->color_type = pVar33;
      row_info->channels = pVar13;
    }
    else {
      if (((png_ptr->transformations >> 0x19 & 1) == 0) || (png_ptr->num_trans == 0)) {
        trans_color = (png_const_color_16p)0x0;
      }
      else {
        trans_color = &png_ptr->trans_color;
      }
      png_do_expand(row_info,ppVar24 + 1,trans_color);
    }
  }
LAB_001156fe:
  uVar30 = png_ptr->transformations;
  if (((uVar30 & 0x40080) == 0x40000) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
    uVar30 = png_ptr->transformations;
  }
  if (((uVar30 & 0x600000) != 0) && (bVar9 = row_info->color_type, (bVar9 & 3) == 2)) {
    puVar32 = (ushort *)(png_ptr->row_buf + 1);
    uVar21 = png_ptr->rgb_to_gray_red_coeff;
    uVar26 = png_ptr->rgb_to_gray_green_coeff;
    iVar41 = (0x8000 - (uint)uVar21) - (uint)uVar26;
    uVar30 = row_info->width;
    local_40 = (ulong)uVar30;
    local_50 = row_info;
    uVar47 = (uint)uVar21;
    uVar29 = (uint)uVar26;
    if (row_info->bit_depth == '\b') {
      local_48 = (png_uint_16pp)png_ptr->gamma_from_1;
      if ((local_48 == (png_uint_16pp)0x0) ||
         (ppVar24 = png_ptr->gamma_to_1, ppVar24 == (png_bytep)0x0)) {
        if (uVar30 == 0) goto LAB_00115afa;
        bVar51 = false;
        uVar17 = local_40;
        puVar49 = puVar32;
        do {
          bVar36 = (byte)*puVar32;
          if (bVar36 != (byte)puVar32[1] || *(byte *)((long)puVar32 + 1) != bVar36) {
            bVar36 = (byte)((uint)(byte)puVar32[1] * iVar41 +
                            *(byte *)((long)puVar32 + 1) * uVar29 + bVar36 * uVar47 >> 0xf);
            bVar51 = true;
          }
          *(byte *)puVar49 = bVar36;
          if ((bVar9 & 4) == 0) {
            puVar32 = (ushort *)((long)puVar32 + 3);
            puVar49 = (ushort *)((long)puVar49 + 1);
          }
          else {
            pbVar16 = (byte *)((long)puVar32 + 3);
            puVar32 = puVar32 + 2;
            *(byte *)((long)puVar49 + 1) = *pbVar16;
            puVar49 = puVar49 + 1;
          }
          uVar30 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar30;
        } while (uVar30 != 0);
      }
      else if (uVar30 == 0) {
LAB_00115afa:
        bVar51 = false;
      }
      else {
        bVar51 = false;
        uVar17 = local_40;
        puVar49 = puVar32;
        do {
          bVar36 = (byte)*puVar32;
          if (bVar36 == (byte)puVar32[1] && *(byte *)((long)puVar32 + 1) == bVar36) {
            if (png_ptr->gamma_table != (png_bytep)0x0) {
              pbVar16 = png_ptr->gamma_table + bVar36;
              goto LAB_0011584c;
            }
          }
          else {
            pbVar16 = (byte *)((ulong)((uint)ppVar24[(byte)puVar32[1]] * iVar41 +
                                       ppVar24[*(byte *)((long)puVar32 + 1)] * uVar29 +
                                       ppVar24[bVar36] * uVar47 + 0x4000 >> 0xf) + (long)local_48);
            bVar51 = true;
LAB_0011584c:
            bVar36 = *pbVar16;
          }
          *(byte *)puVar49 = bVar36;
          if ((bVar9 & 4) == 0) {
            puVar32 = (ushort *)((long)puVar32 + 3);
            puVar49 = (ushort *)((long)puVar49 + 1);
          }
          else {
            pbVar16 = (byte *)((long)puVar32 + 3);
            puVar32 = puVar32 + 2;
            *(byte *)((long)puVar49 + 1) = *pbVar16;
            puVar49 = puVar49 + 1;
          }
          uVar30 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar30;
        } while (uVar30 != 0);
      }
    }
    else {
      local_48 = png_ptr->gamma_16_to_1;
      if (local_48 != (png_uint_16pp)0x0) {
        local_38 = png_ptr->gamma_16_from_1;
        if (local_38 != (png_uint_16pp)0x0) {
          if (uVar30 == 0) goto LAB_00115afa;
          bVar51 = false;
          puVar49 = puVar32;
          uVar17 = local_40;
          do {
            uVar28 = *puVar32;
            uVar2 = puVar32[2];
            uVar15 = uVar28 << 8 | uVar28 >> 8;
            bVar36 = (byte)puVar32[1];
            bVar38 = *(byte *)((long)puVar32 + 3);
            uVar25 = uVar2 << 8 | uVar2 >> 8;
            if (((uint)CONCAT11(bVar36,bVar38) == (uint)uVar15) && (uVar15 == uVar25)) {
              if (png_ptr->gamma_16_table != (png_uint_16pp)0x0) {
                puVar50 = (ushort *)
                          ((ulong)((uint)bVar36 + (uint)bVar36) +
                          (long)png_ptr->gamma_16_table
                                [bVar38 >> ((byte)png_ptr->gamma_shift & 0x1f)]);
                goto LAB_001159a9;
              }
            }
            else {
              bVar1 = (byte)png_ptr->gamma_shift;
              uVar30 = (uint)local_48[(uVar25 & 0xff) >> (bVar1 & 0x1f)][uVar2 & 0xff] * iVar41 +
                       (uint)local_48[bVar38 >> (bVar1 & 0x1f)][bVar36] * (uint)uVar26 +
                       (uint)local_48[(uVar15 & 0xff) >> (bVar1 & 0x1f)][uVar28 & 0xff] *
                       (uint)uVar21 + 0x4000;
              puVar50 = (ushort *)
                        ((ulong)(uVar30 >> 0x16 & 0x1fe) +
                        (long)local_38[(uVar30 >> 0xf & 0xff) >> (bVar1 & 0x1f)]);
              bVar51 = true;
LAB_001159a9:
              uVar15 = *puVar50;
            }
            *puVar49 = uVar15 << 8 | uVar15 >> 8;
            if ((bVar9 & 4) == 0) {
              puVar32 = puVar32 + 3;
              puVar49 = puVar49 + 1;
            }
            else {
              *(byte *)(puVar49 + 1) = (byte)puVar32[3];
              pbVar16 = (byte *)((long)puVar32 + 7);
              puVar32 = puVar32 + 4;
              *(byte *)((long)puVar49 + 3) = *pbVar16;
              puVar49 = puVar49 + 2;
            }
            uVar30 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar30;
          } while (uVar30 != 0);
          goto LAB_00115afd;
        }
      }
      if (uVar30 == 0) goto LAB_00115afa;
      bVar51 = false;
      uVar17 = local_40;
      puVar49 = puVar32;
      do {
        uVar21 = *puVar49 << 8 | *puVar49 >> 8;
        uVar26 = puVar49[1] << 8 | puVar49[1] >> 8;
        uVar28 = puVar49[2] << 8 | puVar49[2] >> 8;
        if (uVar21 != uVar28 || uVar21 != uVar26) {
          bVar51 = true;
        }
        uVar30 = (uint)uVar28 * iVar41 + uVar26 * uVar29 + uVar21 * uVar47 + 0x4000;
        *(byte *)puVar32 = (byte)(uVar30 >> 0x17);
        *(byte *)((long)puVar32 + 1) = (byte)(uVar30 >> 0xf);
        if ((bVar9 & 4) == 0) {
          puVar49 = puVar49 + 3;
          puVar32 = puVar32 + 1;
        }
        else {
          *(byte *)(puVar32 + 1) = (byte)puVar49[3];
          pbVar16 = (byte *)((long)puVar49 + 7);
          puVar49 = puVar49 + 4;
          *(byte *)((long)puVar32 + 3) = *pbVar16;
          puVar32 = puVar32 + 2;
        }
        uVar30 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar30;
      } while (uVar30 != 0);
    }
LAB_00115afd:
    pVar13 = row_info->channels + 0xfe;
    row_info->channels = pVar13;
    row_info->color_type = row_info->color_type & 0xfd;
    bVar9 = row_info->bit_depth * pVar13;
    row_info->pixel_depth = bVar9;
    if (bVar9 < 8) {
      uVar17 = bVar9 * local_40 + 7 >> 3;
    }
    else {
      uVar17 = (bVar9 >> 3) * local_40;
    }
    row_info->rowbytes = uVar17;
    uVar30 = png_ptr->transformations;
    if (bVar51) {
      png_ptr->rgb_to_gray_status = '\x01';
      if ((uVar30 & 0x600000) == 0x400000) {
        png_warning(png_ptr,"png_do_rgb_to_gray found nongray pixel");
        uVar30 = png_ptr->transformations;
      }
      if ((uVar30 & 0x600000) == 0x200000) {
        error_message = "png_do_rgb_to_gray found nongray pixel";
        goto LAB_00117ca2;
      }
    }
  }
  if (((uVar30 >> 0xe & 1) != 0) && ((png_ptr->mode & 0x800) == 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if (((char)uVar30 < '\0') && (row_info->color_type < 7)) {
    pbVar34 = png_ptr->row_buf;
    pbVar16 = pbVar34 + 1;
    ppVar24 = png_ptr->gamma_table;
    ppVar12 = png_ptr->gamma_from_1;
    ppVar43 = png_ptr->gamma_to_1;
    pppVar4 = png_ptr->gamma_16_table;
    pppVar5 = png_ptr->gamma_16_from_1;
    pppVar6 = png_ptr->gamma_16_to_1;
    uVar30 = png_ptr->flags;
    pVar10 = row_info->width;
    bVar9 = (byte)png_ptr->gamma_shift;
    switch(row_info->color_type) {
    case '\0':
      switch(row_info->bit_depth) {
      case '\x01':
        if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).gray;
          uVar30 = 7;
          do {
            if (((*pbVar16 >> (uVar30 & 0x1f) & 1) != 0) == uVar21) {
              *pbVar16 = (byte)(*(int *)&(png_ptr->background).gray << ((byte)uVar30 & 0x1f)) |
                         (byte)(0x7f7f >> (7 - (byte)uVar30 & 0x1f)) & *pbVar16;
            }
            bVar51 = uVar30 == 0;
            uVar30 = uVar30 - 1;
            if (bVar51) {
              uVar30 = 7;
            }
            pbVar16 = pbVar16 + bVar51;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\x02':
        if (ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            pVar27 = (png_ptr->trans_color).gray;
            iVar41 = 6;
            do {
              bVar9 = (byte)iVar41;
              if ((*pbVar16 >> (bVar9 & 0x1f) & 3) == pVar27) {
                *pbVar16 = (byte)(*(int *)&(png_ptr->background).gray << (bVar9 & 0x1f)) |
                           (byte)(0x3f3f >> (6 - bVar9 & 0x1f)) & *pbVar16;
              }
              bVar51 = iVar41 == 0;
              iVar41 = iVar41 + -2;
              if (bVar51) {
                iVar41 = 6;
              }
              pbVar16 = pbVar16 + bVar51;
              pVar10 = pVar10 - 1;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).gray;
          iVar41 = 6;
          do {
            bVar9 = (byte)iVar41;
            uVar30 = *pbVar16 >> (bVar9 & 0x1f) & 3;
            if (uVar30 == uVar21) {
              uVar30 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar30 = (uint)(ppVar24[(ulong)uVar30 * 0x55] >> 6);
            }
            *pbVar16 = (byte)(uVar30 << (bVar9 & 0x1f)) |
                       (byte)(0x3f3f >> (6 - bVar9 & 0x1f)) & *pbVar16;
            bVar51 = iVar41 == 0;
            iVar41 = iVar41 + -2;
            if (bVar51) {
              iVar41 = 6;
            }
            pbVar16 = pbVar16 + bVar51;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\x03':
      case '\x05':
      case '\x06':
      case '\a':
        break;
      case '\x04':
        if (ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            pVar27 = (png_ptr->trans_color).gray;
            iVar41 = 4;
            do {
              bVar9 = (byte)iVar41;
              if ((*pbVar16 >> (bVar9 & 0x1f) & 0xf) == pVar27) {
                *pbVar16 = (byte)(*(int *)&(png_ptr->background).gray << (bVar9 & 0x1f)) |
                           (byte)(0xf0f >> (4 - bVar9 & 0x1f)) & *pbVar16;
              }
              bVar51 = iVar41 == 0;
              iVar41 = iVar41 + -4;
              if (bVar51) {
                iVar41 = 4;
              }
              pbVar16 = pbVar16 + bVar51;
              pVar10 = pVar10 - 1;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).gray;
          iVar41 = 4;
          do {
            bVar9 = (byte)iVar41;
            uVar30 = *pbVar16 >> (bVar9 & 0x1f) & 0xf;
            if (uVar30 == uVar21) {
              uVar30 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar30 = (uint)(ppVar24[uVar30 << 4 | uVar30] >> 4);
            }
            *pbVar16 = (byte)(uVar30 << (bVar9 & 0x1f)) |
                       (byte)(0xf0f >> (4 - bVar9 & 0x1f)) & *pbVar16;
            bVar51 = iVar41 == 0;
            iVar41 = iVar41 + -4;
            if (bVar51) {
              iVar41 = 4;
            }
            pbVar16 = pbVar16 + bVar51;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
        break;
      case '\b':
        if (ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            uVar21 = (png_ptr->trans_color).gray;
            lVar22 = 0;
            do {
              if (uVar21 == pbVar16[lVar22]) {
                pbVar16[lVar22] = (byte)(png_ptr->background).gray;
              }
              lVar22 = lVar22 + 1;
            } while (pVar10 != (png_uint_32)lVar22);
          }
        }
        else if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).gray;
          lVar22 = 0;
          do {
            if (uVar21 == pbVar16[lVar22]) {
              bVar9 = (byte)(png_ptr->background).gray;
            }
            else {
              bVar9 = ppVar24[(ushort)pbVar16[lVar22]];
            }
            pbVar16[lVar22] = bVar9;
            lVar22 = lVar22 + 1;
          } while (pVar10 != (png_uint_32)lVar22);
        }
        break;
      default:
        if (row_info->bit_depth == '\x10') {
          if (pppVar4 == (png_uint_16pp)0x0) {
            if (pVar10 != 0) {
              uVar21 = (png_ptr->trans_color).gray;
              lVar22 = 0;
              do {
                if ((ushort)(*(ushort *)(pbVar34 + lVar22 * 2 + 1) << 8 |
                            *(ushort *)(pbVar34 + lVar22 * 2 + 1) >> 8) == uVar21) {
                  uVar26 = (png_ptr->background).gray;
                  *(ushort *)(pbVar34 + lVar22 * 2 + 1) = uVar26 << 8 | uVar26 >> 8;
                }
                lVar22 = lVar22 + 1;
              } while (pVar10 != (png_uint_32)lVar22);
            }
          }
          else if (pVar10 != 0) {
            pVar27 = (png_ptr->trans_color).gray;
            lVar22 = 0;
            do {
              bVar36 = pbVar16[lVar22 * 2];
              ppVar37 = &(png_ptr->background).gray;
              if (CONCAT11(bVar36,pbVar34[lVar22 * 2 + 2]) != pVar27) {
                ppVar37 = (png_uint_16 *)
                          ((ulong)((uint)bVar36 + (uint)bVar36) +
                          (long)pppVar4[pbVar34[lVar22 * 2 + 2] >> (bVar9 & 0x1f)]);
              }
              *(png_uint_16 *)(pbVar16 + lVar22 * 2) = *ppVar37 << 8 | *ppVar37 >> 8;
              lVar22 = lVar22 + 1;
            } while (pVar10 != (png_uint_32)lVar22);
          }
        }
      }
      break;
    case '\x02':
      if (row_info->bit_depth == '\b') {
        if (ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            uVar21 = (png_ptr->trans_color).red;
            do {
              pbVar16 = pbVar34 + 3;
              if (((uVar21 == pbVar34[1]) && ((png_ptr->trans_color).green == (ushort)pbVar34[2]))
                 && ((png_ptr->trans_color).blue == (ushort)*pbVar16)) {
                pbVar34[1] = (byte)(png_ptr->background).red;
                pbVar34[2] = (byte)(png_ptr->background).green;
                *pbVar16 = (byte)(png_ptr->background).blue;
              }
              pVar10 = pVar10 - 1;
              pbVar34 = pbVar16;
            } while (pVar10 != 0);
          }
        }
        else if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).red;
          do {
            pbVar16 = pbVar34 + 3;
            if (((uVar21 == pbVar34[1]) && ((png_ptr->trans_color).green == (ushort)pbVar34[2])) &&
               ((png_ptr->trans_color).blue == (ushort)*pbVar16)) {
              pbVar34[1] = (byte)(png_ptr->background).red;
              pbVar34[2] = (byte)(png_ptr->background).green;
              bVar9 = (byte)(png_ptr->background).blue;
            }
            else {
              pbVar34[1] = ppVar24[(ushort)pbVar34[1]];
              pbVar34[2] = ppVar24[pbVar34[2]];
              bVar9 = ppVar24[*pbVar16];
            }
            *pbVar16 = bVar9;
            pVar10 = pVar10 - 1;
            pbVar34 = pbVar16;
          } while (pVar10 != 0);
        }
      }
      else if (pppVar4 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          uVar21 = (png_ptr->trans_color).red;
          do {
            if ((((ushort)(*(ushort *)(pbVar34 + 1) << 8 | *(ushort *)(pbVar34 + 1) >> 8) == uVar21)
                && ((ushort)(*(ushort *)(pbVar34 + 3) << 8 | *(ushort *)(pbVar34 + 3) >> 8) ==
                    (png_ptr->trans_color).green)) &&
               ((ushort)(*(ushort *)(pbVar34 + 5) << 8 | *(ushort *)(pbVar34 + 5) >> 8) ==
                (png_ptr->trans_color).blue)) {
              uVar26 = (png_ptr->background).red;
              *(ushort *)(pbVar34 + 1) = uVar26 << 8 | uVar26 >> 8;
              uVar26 = (png_ptr->background).green;
              *(ushort *)(pbVar34 + 3) = uVar26 << 8 | uVar26 >> 8;
              uVar26 = (png_ptr->background).blue;
              *(ushort *)(pbVar34 + 5) = uVar26 << 8 | uVar26 >> 8;
            }
            pVar10 = pVar10 - 1;
            pbVar34 = pbVar34 + 6;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pVar27 = (png_ptr->trans_color).red;
        do {
          bVar36 = pbVar34[6];
          if (((CONCAT11(pbVar34[1],pbVar34[2]) == pVar27) &&
              (CONCAT11(pbVar34[3],pbVar34[4]) == (png_ptr->trans_color).green)) &&
             (CONCAT11(pbVar34[5],bVar36) == (png_ptr->trans_color).blue)) {
            uVar21 = (png_ptr->background).red;
            *(ushort *)(pbVar34 + 1) = uVar21 << 8 | uVar21 >> 8;
            uVar21 = (png_ptr->background).green;
            *(ushort *)(pbVar34 + 3) = uVar21 << 8 | uVar21 >> 8;
            ppVar37 = &(png_ptr->background).blue;
          }
          else {
            *(png_uint_16 *)(pbVar34 + 1) =
                 pppVar4[pbVar34[2] >> (bVar9 & 0x1f)][pbVar34[1]] << 8 |
                 pppVar4[pbVar34[2] >> (bVar9 & 0x1f)][pbVar34[1]] >> 8;
            *(png_uint_16 *)(pbVar34 + 3) =
                 pppVar4[pbVar34[4] >> (bVar9 & 0x1f)][pbVar34[3]] << 8 |
                 pppVar4[pbVar34[4] >> (bVar9 & 0x1f)][pbVar34[3]] >> 8;
            ppVar37 = (png_uint_16 *)
                      ((ulong)((uint)pbVar34[5] * 2) + (long)pppVar4[bVar36 >> (bVar9 & 0x1f)]);
          }
          *(png_uint_16 *)(pbVar34 + 5) = *ppVar37 << 8 | *ppVar37 >> 8;
          pVar10 = pVar10 - 1;
          pbVar34 = pbVar34 + 6;
        } while (pVar10 != 0);
      }
      break;
    case '\x04':
      if (row_info->bit_depth == '\b') {
        if ((ppVar12 == (png_bytep)0x0 || ppVar43 == (png_bytep)0x0) || ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            lVar22 = 0;
            do {
              bVar9 = pbVar34[lVar22 * 2 + 2];
              if (bVar9 != 0xff) {
                if (bVar9 == 0) {
                  bVar9 = (byte)(png_ptr->background).gray;
                }
                else {
                  uVar21 = (ushort)(byte)~bVar9 * (png_ptr->background).gray +
                           (ushort)pbVar34[lVar22 * 2 + 1] * (ushort)bVar9 + 0x80;
                  bVar9 = (byte)((uint)(uVar21 >> 8) + (uint)uVar21 >> 8);
                }
                pbVar34[lVar22 * 2 + 1] = bVar9;
              }
              lVar22 = lVar22 + 1;
            } while (pVar10 != (png_uint_32)lVar22);
          }
        }
        else if (pVar10 != 0) {
          lVar22 = 0;
          do {
            bVar9 = pbVar34[lVar22 * 2 + 2];
            if (bVar9 == 0) {
              bVar9 = (byte)(png_ptr->background).gray;
            }
            else if (bVar9 == 0xff) {
              bVar9 = ppVar24[pbVar16[lVar22 * 2]];
            }
            else {
              uVar47 = (uint)(ushort)((ushort)(byte)~bVar9 * (png_ptr->background_1).gray) +
                       (uint)ppVar43[pbVar16[lVar22 * 2]] * (uint)bVar9 + 0x80 & 0xffff;
              bVar9 = (byte)((uVar47 >> 8) + uVar47 >> 8);
              if ((uVar30 >> 0xd & 1) == 0) {
                bVar9 = ppVar12[bVar9];
              }
            }
            pbVar16[lVar22 * 2] = bVar9;
            lVar22 = lVar22 + 1;
          } while (pVar10 != (png_uint_32)lVar22);
        }
      }
      else if ((pppVar5 == (png_uint_16pp)0x0 || pppVar4 == (png_uint_16pp)0x0) ||
               pppVar6 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          lVar22 = 0;
          do {
            uVar21 = *(ushort *)(pbVar34 + lVar22 * 4 + 3) << 8 |
                     *(ushort *)(pbVar34 + lVar22 * 4 + 3) >> 8;
            if (uVar21 != 0xffff) {
              if (uVar21 == 0) {
                pVar27 = (png_ptr->background).gray;
                pbVar16[lVar22 * 4] = (byte)(pVar27 >> 8);
                pbVar34[lVar22 * 4 + 2] = (byte)pVar27;
              }
              else {
                iVar46 = (((*(ushort *)(pbVar16 + lVar22 * 4) & 0xff00) << 8 |
                          (uint)*(ushort *)(pbVar16 + lVar22 * 4) << 0x18) >> 0x10) * (uint)uVar21;
                iVar41 = (uVar21 ^ 0xffff) * (uint)(png_ptr->background).gray;
                iVar41 = (iVar41 + iVar46 + 0x8000U >> 0x10) + iVar41 + iVar46 + 0x8000;
                pbVar16[lVar22 * 4] = (byte)((uint)iVar41 >> 0x18);
                pbVar34[lVar22 * 4 + 2] = (byte)((uint)iVar41 >> 0x10);
              }
            }
            lVar22 = lVar22 + 1;
          } while (pVar10 != (png_uint_32)lVar22);
        }
      }
      else if (pVar10 != 0) {
        lVar22 = 0;
        do {
          uVar21 = *(ushort *)(pbVar34 + lVar22 * 4 + 3) << 8 |
                   *(ushort *)(pbVar34 + lVar22 * 4 + 3) >> 8;
          if (uVar21 == 0) {
            pVar27 = (png_ptr->background).gray;
LAB_00116802:
            pbVar16[lVar22 * 4] = (byte)(pVar27 >> 8);
            pbVar34[lVar22 * 4 + 2] = (byte)pVar27;
          }
          else {
            if (uVar21 == 0xffff) {
              pVar27 = pppVar4[pbVar34[lVar22 * 4 + 2] >> (bVar9 & 0x1f)][pbVar16[lVar22 * 4]];
              goto LAB_00116802;
            }
            iVar46 = (uint)pppVar6[pbVar34[lVar22 * 4 + 2] >> (bVar9 & 0x1f)][pbVar16[lVar22 * 4]] *
                     (uint)uVar21;
            iVar41 = (uVar21 ^ 0xffff) * (uint)(png_ptr->background_1).gray;
            uVar47 = (iVar46 + iVar41 + 0x8000U >> 0x10) + iVar46 + iVar41 + 0x8000;
            pVar27 = (png_uint_16)(uVar47 >> 0x10);
            if ((uVar30 >> 0xd & 1) == 0) {
              pVar27 = pppVar5[(uVar47 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar47 >> 0x18];
            }
            *(png_uint_16 *)(pbVar16 + lVar22 * 4) = pVar27 << 8 | pVar27 >> 8;
          }
          lVar22 = lVar22 + 1;
        } while (pVar10 != (png_uint_32)lVar22);
      }
      break;
    case '\x06':
      if (row_info->bit_depth == '\b') {
        if ((ppVar12 == (png_bytep)0x0 || ppVar43 == (png_bytep)0x0) || ppVar24 == (png_bytep)0x0) {
          if (pVar10 != 0) {
            lVar22 = 0;
            do {
              bVar9 = pbVar34[lVar22 * 4 + 4];
              if (bVar9 != 0xff) {
                if (bVar9 == 0) {
                  pbVar34[lVar22 * 4 + 1] = (byte)(png_ptr->background).red;
                  pbVar34[lVar22 * 4 + 2] = (byte)(png_ptr->background).green;
                  pbVar34[lVar22 * 4 + 3] = (byte)(png_ptr->background).blue;
                }
                else {
                  bVar36 = ~bVar9;
                  iVar41 = (uint)(png_ptr->background).red * (uint)bVar36 +
                           (uint)pbVar34[lVar22 * 4 + 1] * (uint)bVar9;
                  pbVar34[lVar22 * 4 + 1] =
                       (byte)((iVar41 + 0x80U >> 8 & 0xff) + iVar41 + 0x80 >> 8);
                  iVar41 = (uint)(png_ptr->background).green * (uint)bVar36 +
                           (uint)pbVar34[lVar22 * 4 + 2] * (uint)bVar9;
                  pbVar34[lVar22 * 4 + 2] =
                       (byte)((iVar41 + 0x80U >> 8 & 0xff) + iVar41 + 0x80 >> 8);
                  iVar41 = (uint)(png_ptr->background).blue * (uint)bVar36 +
                           (uint)pbVar34[lVar22 * 4 + 3] * (uint)bVar9;
                  pbVar34[lVar22 * 4 + 3] =
                       (byte)((iVar41 + 0x80U >> 8 & 0xff) + iVar41 + 0x80 >> 8);
                }
              }
              lVar22 = lVar22 + 1;
            } while (pVar10 != (png_uint_32)lVar22);
          }
        }
        else if (pVar10 != 0) {
          lVar22 = 0;
          do {
            bVar9 = pbVar34[lVar22 * 4 + 4];
            if (bVar9 == 0) {
              pbVar16[lVar22 * 4] = (byte)(png_ptr->background).red;
              pbVar34[lVar22 * 4 + 2] = (byte)(png_ptr->background).green;
              bVar9 = (byte)(png_ptr->background).blue;
LAB_0011615a:
              pbVar34[lVar22 * 4 + 3] = bVar9;
            }
            else {
              uVar47 = (uint)bVar9;
              if (uVar47 == 0xff) {
                pbVar16[lVar22 * 4] = ppVar24[pbVar16[lVar22 * 4]];
                pbVar34[lVar22 * 4 + 2] = ppVar24[pbVar34[lVar22 * 4 + 2]];
                bVar9 = ppVar24[pbVar34[lVar22 * 4 + 3]];
                goto LAB_0011615a;
              }
              bVar38 = ~bVar9;
              iVar41 = (uint)(png_ptr->background_1).red * (uint)bVar38;
              bVar36 = (byte)((iVar41 + ppVar43[pbVar16[lVar22 * 4]] * uVar47 + 0x80 >> 8 & 0xff) +
                              ppVar43[pbVar16[lVar22 * 4]] * uVar47 + iVar41 + 0x80 >> 8);
              if ((uVar30 >> 0xd & 1) == 0) {
                bVar36 = ppVar12[bVar36];
              }
              pbVar16[lVar22 * 4] = bVar36;
              iVar41 = (uint)(png_ptr->background_1).green * (uint)bVar38;
              bVar36 = (byte)((iVar41 + ppVar43[pbVar34[lVar22 * 4 + 2]] * uVar47 + 0x80 >> 8 & 0xff
                              ) + ppVar43[pbVar34[lVar22 * 4 + 2]] * uVar47 + iVar41 + 0x80 >> 8);
              if ((uVar30 >> 0xd & 1) == 0) {
                bVar36 = ppVar12[bVar36];
              }
              pbVar34[lVar22 * 4 + 2] = bVar36;
              iVar41 = (uint)(png_ptr->background_1).blue * (uint)bVar38;
              bVar9 = (byte)(((uint)ppVar43[pbVar34[lVar22 * 4 + 3]] * (uint)bVar9 + iVar41 + 0x80
                              >> 8 & 0xff) +
                             (uint)ppVar43[pbVar34[lVar22 * 4 + 3]] * (uint)bVar9 + iVar41 + 0x80 >>
                            8);
              if ((uVar30 >> 0xd & 1) == 0) {
                bVar9 = ppVar12[bVar9];
              }
              pbVar34[lVar22 * 4 + 3] = bVar9;
            }
            lVar22 = lVar22 + 1;
          } while (pVar10 != (png_uint_32)lVar22);
        }
      }
      else if ((pppVar5 == (png_uint_16pp)0x0 || pppVar4 == (png_uint_16pp)0x0) ||
               pppVar6 == (png_uint_16pp)0x0) {
        if (pVar10 != 0) {
          lVar22 = 0;
          do {
            uVar21 = *(ushort *)(pbVar34 + lVar22 * 8 + 7) << 8 |
                     *(ushort *)(pbVar34 + lVar22 * 8 + 7) >> 8;
            if (uVar21 != 0xffff) {
              if (uVar21 == 0) {
                pVar27 = (png_ptr->background).red;
                pbVar16[lVar22 * 8] = (byte)(pVar27 >> 8);
                pbVar34[lVar22 * 8 + 2] = (byte)pVar27;
                uVar21 = (png_ptr->background).green;
                *(ushort *)(pbVar34 + lVar22 * 8 + 3) = uVar21 << 8 | uVar21 >> 8;
                uVar21 = (png_ptr->background).blue;
                *(ushort *)(pbVar34 + lVar22 * 8 + 5) = uVar21 << 8 | uVar21 >> 8;
              }
              else {
                uVar26 = *(ushort *)(pbVar34 + lVar22 * 8 + 3);
                uVar28 = *(ushort *)(pbVar34 + lVar22 * 8 + 5);
                uVar30 = (uint)uVar21;
                uVar47 = uVar30 ^ 0xffff;
                iVar41 = (png_ptr->background).red * uVar47 +
                         (((*(ushort *)(pbVar16 + lVar22 * 8) & 0xff00) << 8 |
                          (uint)*(ushort *)(pbVar16 + lVar22 * 8) << 0x18) >> 0x10) * uVar30;
                iVar41 = (iVar41 + 0x8000U >> 0x10) + iVar41 + 0x8000;
                pbVar16[lVar22 * 8] = (byte)((uint)iVar41 >> 0x18);
                pbVar34[lVar22 * 8 + 2] = (byte)((uint)iVar41 >> 0x10);
                iVar41 = (png_ptr->background).green * uVar47 +
                         (ushort)(uVar26 << 8 | uVar26 >> 8) * uVar30;
                iVar41 = (iVar41 + 0x8000U >> 0x10) + iVar41 + 0x8000;
                pbVar34[lVar22 * 8 + 3] = (byte)((uint)iVar41 >> 0x18);
                pbVar34[lVar22 * 8 + 4] = (byte)((uint)iVar41 >> 0x10);
                iVar41 = (png_ptr->background).blue * uVar47 +
                         (ushort)(uVar28 << 8 | uVar28 >> 8) * uVar30;
                iVar41 = iVar41 + (iVar41 + 0x8000U >> 0x10) + 0x8000;
                pbVar34[lVar22 * 8 + 5] = (byte)((uint)iVar41 >> 0x18);
                pbVar34[lVar22 * 8 + 6] = (byte)((uint)iVar41 >> 0x10);
              }
            }
            lVar22 = lVar22 + 1;
          } while (pVar10 != (png_uint_32)lVar22);
        }
      }
      else if (pVar10 != 0) {
        lVar22 = 0;
        do {
          uVar21 = *(ushort *)(pbVar34 + lVar22 * 8 + 7) << 8 |
                   *(ushort *)(pbVar34 + lVar22 * 8 + 7) >> 8;
          if (uVar21 == 0) {
            pVar27 = (png_ptr->background).red;
            pbVar16[lVar22 * 8] = (byte)(pVar27 >> 8);
            pbVar34[lVar22 * 8 + 2] = (byte)pVar27;
            uVar21 = (png_ptr->background).green;
            *(ushort *)(pbVar34 + lVar22 * 8 + 3) = uVar21 << 8 | uVar21 >> 8;
            pVar27 = (png_ptr->background).blue;
LAB_00116a78:
            *(png_uint_16 *)(pbVar34 + lVar22 * 8 + 5) = pVar27 << 8 | pVar27 >> 8;
          }
          else {
            if (uVar21 == 0xffff) {
              pVar27 = pppVar4[pbVar34[lVar22 * 8 + 2] >> (bVar9 & 0x1f)][pbVar16[lVar22 * 8]];
              pbVar16[lVar22 * 8] = (byte)(pVar27 >> 8);
              pbVar34[lVar22 * 8 + 2] = (byte)pVar27;
              *(png_uint_16 *)(pbVar34 + lVar22 * 8 + 3) =
                   pppVar4[pbVar34[lVar22 * 8 + 4] >> (bVar9 & 0x1f)][pbVar34[lVar22 * 8 + 3]] << 8
                   | pppVar4[pbVar34[lVar22 * 8 + 4] >> (bVar9 & 0x1f)][pbVar34[lVar22 * 8 + 3]] >>
                     8;
              pVar27 = pppVar4[pbVar34[lVar22 * 8 + 6] >> (bVar9 & 0x1f)][pbVar34[lVar22 * 8 + 5]];
              goto LAB_00116a78;
            }
            iVar41 = (uint)pppVar6[pbVar34[lVar22 * 8 + 2] >> (bVar9 & 0x1f)][pbVar16[lVar22 * 8]] *
                     (uint)uVar21;
            uVar29 = (uint)uVar21;
            uVar44 = uVar29 ^ 0xffff;
            iVar46 = (png_ptr->background_1).red * uVar44;
            uVar47 = iVar41 + iVar46 + (iVar41 + iVar46 + 0x8000U >> 0x10) + 0x8000;
            pVar27 = (png_uint_16)(uVar47 >> 0x10);
            if ((uVar30 >> 0xd & 1) == 0) {
              pVar27 = pppVar5[(uVar47 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar47 >> 0x18];
            }
            *(png_uint_16 *)(pbVar16 + lVar22 * 8) = pVar27 << 8 | pVar27 >> 8;
            iVar41 = (png_ptr->background_1).green * uVar44;
            uVar47 = pppVar6[pbVar34[lVar22 * 8 + 4] >> (bVar9 & 0x1f)][pbVar34[lVar22 * 8 + 3]] *
                     uVar29 + iVar41 +
                     (pppVar6[pbVar34[lVar22 * 8 + 4] >> (bVar9 & 0x1f)][pbVar34[lVar22 * 8 + 3]] *
                      uVar29 + iVar41 + 0x8000 >> 0x10) + 0x8000;
            pVar27 = (png_uint_16)(uVar47 >> 0x10);
            if ((uVar30 >> 0xd & 1) == 0) {
              pVar27 = pppVar5[(uVar47 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar47 >> 0x18];
            }
            *(png_uint_16 *)(pbVar34 + lVar22 * 8 + 3) = pVar27 << 8 | pVar27 >> 8;
            iVar41 = uVar44 * (png_ptr->background_1).blue;
            uVar47 = (uVar29 * pppVar6[pbVar34[lVar22 * 8 + 6] >> (bVar9 & 0x1f)]
                               [pbVar34[lVar22 * 8 + 5]] + iVar41 + 0x8000 >> 0x10) +
                     uVar29 * pppVar6[pbVar34[lVar22 * 8 + 6] >> (bVar9 & 0x1f)]
                              [pbVar34[lVar22 * 8 + 5]] + iVar41 + 0x8000;
            pVar27 = (png_uint_16)(uVar47 >> 0x10);
            if ((uVar30 >> 0xd & 1) == 0) {
              pVar27 = pppVar5[(uVar47 >> 0x10 & 0xff) >> (bVar9 & 0x1f)][uVar47 >> 0x18];
            }
            *(png_uint_16 *)(pbVar34 + lVar22 * 8 + 5) = pVar27 << 8 | pVar27 >> 8;
          }
          lVar22 = lVar22 + 1;
        } while (pVar10 != (png_uint_32)lVar22);
      }
    }
  }
  if ((png_ptr->transformations & 0x602000) == 0x2000) {
    if ((char)png_ptr->transformations < '\0') {
      if ((png_ptr->num_trans != 0) || (bVar9 = png_ptr->color_type, (bVar9 & 4) != 0))
      goto switchD_00115c76_caseD_1;
    }
    else {
      bVar9 = png_ptr->color_type;
    }
    if (bVar9 != 3) {
      pbVar16 = png_ptr->row_buf;
      ppVar24 = png_ptr->gamma_table;
      pppVar4 = png_ptr->gamma_16_table;
      uVar30 = row_info->width;
      bVar9 = row_info->bit_depth;
      if (((bVar9 < 9 && ppVar24 != (png_bytep)0x0) ||
          (pppVar4 != (png_uint_16pp)0x0 && bVar9 == 0x10)) && (row_info->color_type < 7)) {
        pbVar34 = pbVar16 + 1;
        bVar36 = (byte)png_ptr->gamma_shift;
        switch(row_info->color_type) {
        case '\0':
          if (uVar30 != 0 && bVar9 == 2) {
            local_50 = row_info;
            uVar47 = 0;
            pbVar42 = pbVar34;
            do {
              bVar9 = *pbVar42;
              uVar45 = (uint)bVar9;
              uVar29 = uVar45 & 0xffffffc0;
              uVar44 = bVar9 & 0x30;
              uVar48 = uVar45 & 0xc;
              *pbVar42 = ppVar24[(ulong)(uVar45 & 3) * 0x55] >> 6 |
                         ppVar24[uVar48 >> 2 | uVar48 * 0x14 | uVar48] >> 4 & 0xc |
                         ppVar24[uVar44 >> 4 | (uVar44 >> 2) + uVar44 * 4 | uVar44] >> 2 & 0x30 |
                         ppVar24[(uint)(bVar9 >> 6) | uVar29 >> 4 | uVar29 >> 2 | uVar29] & 0xc0;
              pbVar42 = pbVar42 + 1;
              uVar47 = uVar47 + 4;
            } while (uVar47 < uVar30);
            bVar9 = row_info->bit_depth;
          }
          if (bVar9 == 4) {
            if (uVar30 != 0) {
              uVar47 = 0;
              do {
                bVar9 = *pbVar34;
                uVar29 = bVar9 & 0xf;
                *pbVar34 = ppVar24[uVar29 << 4 | uVar29] >> 4 |
                           ppVar24[(ulong)(bVar9 >> 4) | (ulong)(bVar9 & 0xfffffff0)] & 0xf0;
                pbVar34 = pbVar34 + 1;
                uVar47 = uVar47 + 2;
              } while (uVar47 < uVar30);
            }
          }
          else if (bVar9 == 8) {
            if (uVar30 != 0) {
              lVar22 = 0;
              do {
                pbVar34[lVar22] = ppVar24[pbVar34[lVar22]];
                lVar22 = lVar22 + 1;
              } while (uVar30 != (uint)lVar22);
            }
          }
          else if ((bVar9 == 0x10) && (uVar30 != 0)) {
            lVar22 = 0;
            do {
              *(png_uint_16 *)(pbVar16 + lVar22 * 2 + 1) =
                   pppVar4[pbVar16[lVar22 * 2 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 2 + 1]] << 8
                   | pppVar4[pbVar16[lVar22 * 2 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 2 + 1]] >>
                     8;
              lVar22 = lVar22 + 1;
            } while (uVar30 != (uint)lVar22);
          }
          break;
        case '\x02':
          if (bVar9 == 8) {
            for (; uVar30 != 0; uVar30 = uVar30 - 1) {
              *pbVar34 = ppVar24[*pbVar34];
              pbVar34[1] = ppVar24[pbVar34[1]];
              pbVar34[2] = ppVar24[pbVar34[2]];
              pbVar34 = pbVar34 + 3;
            }
          }
          else {
            for (; uVar30 != 0; uVar30 = uVar30 - 1) {
              *(png_uint_16 *)(pbVar16 + 1) =
                   pppVar4[pbVar16[2] >> (bVar36 & 0x1f)][pbVar16[1]] << 8 |
                   pppVar4[pbVar16[2] >> (bVar36 & 0x1f)][pbVar16[1]] >> 8;
              *(png_uint_16 *)(pbVar16 + 3) =
                   pppVar4[pbVar16[4] >> (bVar36 & 0x1f)][pbVar16[3]] << 8 |
                   pppVar4[pbVar16[4] >> (bVar36 & 0x1f)][pbVar16[3]] >> 8;
              *(png_uint_16 *)(pbVar16 + 5) =
                   pppVar4[pbVar16[6] >> (bVar36 & 0x1f)][pbVar16[5]] << 8 |
                   pppVar4[pbVar16[6] >> (bVar36 & 0x1f)][pbVar16[5]] >> 8;
              pbVar16 = pbVar16 + 6;
            }
          }
          break;
        case '\x04':
          if (bVar9 == 8) {
            if (uVar30 != 0) {
              lVar22 = 0;
              do {
                pbVar34[lVar22 * 2] = ppVar24[pbVar34[lVar22 * 2]];
                lVar22 = lVar22 + 1;
              } while (uVar30 != (uint)lVar22);
            }
          }
          else if (uVar30 != 0) {
            lVar22 = 0;
            do {
              *(png_uint_16 *)(pbVar16 + lVar22 * 4 + 1) =
                   pppVar4[pbVar16[lVar22 * 4 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 4 + 1]] << 8
                   | pppVar4[pbVar16[lVar22 * 4 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 4 + 1]] >>
                     8;
              lVar22 = lVar22 + 1;
            } while (uVar30 != (uint)lVar22);
          }
          break;
        case '\x06':
          if (bVar9 == 8) {
            if (uVar30 != 0) {
              lVar22 = 0;
              do {
                pbVar34[lVar22 * 4] = ppVar24[pbVar34[lVar22 * 4]];
                pbVar16[lVar22 * 4 + 2] = ppVar24[pbVar16[lVar22 * 4 + 2]];
                pbVar16[lVar22 * 4 + 3] = ppVar24[pbVar16[lVar22 * 4 + 3]];
                lVar22 = lVar22 + 1;
              } while (uVar30 != (uint)lVar22);
            }
          }
          else if (uVar30 != 0) {
            lVar22 = 0;
            do {
              *(png_uint_16 *)(pbVar16 + lVar22 * 8 + 1) =
                   pppVar4[pbVar16[lVar22 * 8 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 1]] << 8
                   | pppVar4[pbVar16[lVar22 * 8 + 2] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 1]] >>
                     8;
              *(png_uint_16 *)(pbVar16 + lVar22 * 8 + 3) =
                   pppVar4[pbVar16[lVar22 * 8 + 4] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 3]] << 8
                   | pppVar4[pbVar16[lVar22 * 8 + 4] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 3]] >>
                     8;
              *(png_uint_16 *)(pbVar16 + lVar22 * 8 + 5) =
                   pppVar4[pbVar16[lVar22 * 8 + 6] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 5]] << 8
                   | pppVar4[pbVar16[lVar22 * 8 + 6] >> (bVar36 & 0x1f)][pbVar16[lVar22 * 8 + 5]] >>
                     8;
              lVar22 = lVar22 + 1;
            } while (uVar30 != (uint)lVar22);
          }
        }
      }
    }
  }
switchD_00115c76_caseD_1:
  uVar30 = png_ptr->transformations;
  if (((~uVar30 & 0x40080) == 0) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
    uVar30 = png_ptr->transformations;
  }
  if (((uVar30 >> 0x17 & 1) != 0) && (bVar9 = row_info->color_type, (bVar9 & 4) != 0)) {
    pbVar16 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->bit_depth == '\x10') {
      pppVar4 = png_ptr->gamma_16_from_1;
      if (pppVar4 == (png_uint_16pp)0x0) goto LAB_001162b3;
      if (pVar10 != 0) {
        iVar41 = png_ptr->gamma_shift;
        do {
          pbVar16 = pbVar16 + (ulong)(bVar9 & 2) * 2 + 4;
          uVar21 = pppVar4[*pbVar16 >> ((byte)iVar41 & 0x1f)][pbVar16[-1]];
          *(ushort *)(pbVar16 + -1) = uVar21 << 8 | uVar21 >> 8;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if ((row_info->bit_depth == '\b') &&
            (ppVar24 = png_ptr->gamma_from_1, ppVar24 != (png_bytep)0x0)) {
      if (pVar10 != 0) {
        do {
          pbVar16 = pbVar16 + (ulong)(bVar9 & 2) + 2;
          *pbVar16 = ppVar24[*pbVar16];
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else {
LAB_001162b3:
      png_warning(png_ptr,"png_do_encode_alpha: unexpected call");
    }
  }
  uVar30 = png_ptr->transformations;
  if (((uVar30 >> 0x1a & 1) != 0) && (row_info->bit_depth == '\x10')) {
    sVar18 = row_info->rowbytes;
    if (0 < (long)sVar18) {
      ppVar24 = png_ptr->row_buf;
      lVar22 = 0;
      do {
        pbVar16 = ppVar24 + lVar22 * 2 + 1;
        ppVar24[lVar22 + 1] =
             (char)(((uint)pbVar16[1] - (uint)*pbVar16) * 0xffff + 0x7fff80 >> 0x18) + *pbVar16;
        lVar22 = lVar22 + 1;
      } while (pbVar16 + 2 < ppVar24 + sVar18 + 1);
      uVar30 = png_ptr->transformations;
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
  }
  if (((uVar30 >> 10 & 1) != 0) && (row_info->bit_depth == '\x10')) {
    sVar18 = row_info->rowbytes;
    if (0 < (long)sVar18) {
      ppVar24 = png_ptr->row_buf;
      ppVar12 = ppVar24 + 1;
      ppVar23 = ppVar12;
      do {
        *ppVar23 = *ppVar12;
        ppVar23 = ppVar23 + 1;
        ppVar12 = ppVar12 + 2;
      } while (ppVar12 < ppVar24 + sVar18 + 1);
      uVar30 = png_ptr->transformations;
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
  }
  if ((uVar30 & 0x40) != 0) {
    if (row_info->bit_depth == '\b') {
      ppVar24 = png_ptr->row_buf;
      ppVar12 = png_ptr->palette_lookup;
      pbVar16 = ppVar24 + 1;
      uVar30 = row_info->width;
      uVar17 = (ulong)uVar30;
      pVar13 = row_info->color_type;
      if (ppVar12 == (png_bytep)0x0 || pVar13 != '\x02') {
        if (pVar13 == '\x06' && ppVar12 != (png_bytep)0x0) {
          if (uVar17 == 0) goto LAB_001164c1;
          lVar22 = 0;
          do {
            pbVar16[lVar22] =
                 ppVar12[(uint)(ppVar24[lVar22 * 4 + 3] >> 3) |
                         (pbVar16[lVar22 * 4] & 0xf8) * 0x80 +
                         (ppVar24[lVar22 * 4 + 2] & 0xfffffff8) * 4];
            lVar22 = lVar22 + 1;
          } while (uVar30 != (uint)lVar22);
          goto LAB_0011649a;
        }
        ppVar24 = png_ptr->quantize_index;
        if ((uVar30 != 0 && ppVar24 != (png_bytep)0x0) && pVar13 == '\x03') {
          lVar22 = 0;
          do {
            pbVar16[lVar22] = ppVar24[pbVar16[lVar22]];
            lVar22 = lVar22 + 1;
          } while (uVar30 != (uint)lVar22);
        }
      }
      else {
        if (uVar17 == 0) {
LAB_001164c1:
          row_info->color_type = '\x03';
          row_info->channels = '\x01';
          row_info->pixel_depth = '\b';
          uVar11 = 8;
LAB_001164cf:
          uVar17 = (uVar11 >> 3) * uVar17;
        }
        else {
          lVar22 = 0;
          pbVar34 = pbVar16;
          do {
            pbVar16[lVar22] =
                 ppVar12[(uint)(pbVar34[2] >> 3) |
                         (*pbVar34 & 0xf8) * 0x80 + (pbVar34[1] & 0xfffffff8) * 4];
            lVar22 = lVar22 + 1;
            pbVar34 = pbVar34 + 3;
          } while (uVar30 != (uint)lVar22);
LAB_0011649a:
          uVar11 = (ulong)row_info->bit_depth;
          row_info->color_type = '\x03';
          row_info->channels = '\x01';
          row_info->pixel_depth = row_info->bit_depth;
          if (7 < uVar11) goto LAB_001164cf;
          uVar17 = uVar11 * uVar17 + 7 >> 3;
        }
        row_info->rowbytes = uVar17;
      }
    }
    if (row_info->rowbytes == 0) {
      error_message = "png_do_quantize returned rowbytes=0";
LAB_00117ca2:
      png_error(png_ptr,error_message);
    }
    uVar30 = png_ptr->transformations;
  }
  if ((((uVar30 >> 9 & 1) != 0) && (row_info->bit_depth == '\b')) &&
     (row_info->color_type != '\x03')) {
    sVar18 = row_info->rowbytes;
    if (0 < (long)sVar18) {
      ppVar24 = png_ptr->row_buf + sVar18 * 2 + 1;
      ppVar23 = png_ptr->row_buf + sVar18;
      do {
        pVar13 = *ppVar23;
        ppVar24[-1] = pVar13;
        ppVar24[-2] = pVar13;
        ppVar24 = ppVar24 + -2;
        bVar51 = ppVar23 < ppVar24;
        ppVar23 = ppVar23 + -1;
      } while (bVar51);
      sVar18 = row_info->rowbytes;
      uVar30 = png_ptr->transformations;
    }
    row_info->rowbytes = sVar18 * 2;
    row_info->bit_depth = '\x10';
    row_info->pixel_depth = row_info->channels << 4;
  }
  if (((uVar30 >> 0xe & 1) != 0) && ((png_ptr->mode & 0x800) != 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if ((uVar30 & 0x20) != 0) {
    png_do_invert(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if ((uVar30 >> 0x13 & 1) != 0) {
    ppVar24 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->color_type == '\x04') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          pbVar16 = ppVar24 + row_info->rowbytes;
          do {
            *pbVar16 = ~*pbVar16;
            pbVar16 = pbVar16 + -2;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pbVar16 = ppVar24 + row_info->rowbytes;
        do {
          *pbVar16 = ~*pbVar16;
          pbVar16[-1] = ~pbVar16[-1];
          pbVar16 = pbVar16 + -4;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if (row_info->color_type == '\x06') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          pbVar16 = ppVar24 + row_info->rowbytes;
          do {
            *pbVar16 = ~*pbVar16;
            pbVar16 = pbVar16 + -4;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        pbVar16 = ppVar24 + row_info->rowbytes;
        do {
          *pbVar16 = ~*pbVar16;
          pbVar16[-1] = ~pbVar16[-1];
          pbVar16 = pbVar16 + -8;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
  }
  uVar30 = png_ptr->transformations;
  if (((uVar30 & 8) != 0) && (bVar9 = row_info->color_type, bVar9 != 3)) {
    bVar36 = row_info->bit_depth;
    if ((bVar9 & 2) == 0) {
      bVar38 = (png_ptr->shift).gray;
      uVar17 = 1;
    }
    else {
      bVar38 = (png_ptr->shift).red;
      local_68[1] = (uint)bVar36 - (uint)(png_ptr->shift).green;
      local_68[2] = (uint)bVar36 - (uint)(png_ptr->shift).blue;
      uVar17 = 3;
    }
    ppVar24 = png_ptr->row_buf;
    uVar47 = (uint)bVar36;
    local_68[0] = uVar47 - bVar38;
    uVar11 = uVar17;
    if ((bVar9 & 4) != 0) {
      uVar11 = (ulong)((int)uVar17 + 1);
      local_68[uVar17] = uVar47 - (png_ptr->shift).alpha;
    }
    puVar32 = (ushort *)(ppVar24 + 1);
    uVar17 = 0;
    bVar51 = false;
    do {
      iVar41 = local_68[uVar17];
      bVar8 = iVar41 < 1;
      bVar7 = (int)uVar47 <= iVar41;
      if (bVar8 || bVar7) {
        iVar41 = 0;
      }
      local_68[uVar17] = iVar41;
      if (!bVar8 && !bVar7) {
        bVar51 = true;
      }
      uVar17 = uVar17 + 1;
    } while (uVar11 != uVar17);
    if (bVar51) {
      switch(bVar36 - 2 >> 1 | (uint)((bVar36 - 2 & 1) != 0) << 0x1f) {
      case 0:
        if (0 < (long)row_info->rowbytes) {
          puVar49 = (ushort *)(row_info->rowbytes + (long)puVar32);
          do {
            *(byte *)puVar32 = (byte)*puVar32 >> 1 & 0x55;
            puVar32 = (ushort *)((long)puVar32 + 1);
          } while (puVar32 < puVar49);
        }
        break;
      case 1:
        uVar30 = 0xf >> ((byte)local_68[0] & 0x1f);
        if (0 < (long)row_info->rowbytes) {
          puVar49 = (ushort *)(row_info->rowbytes + (long)puVar32);
          do {
            *(byte *)puVar32 =
                 (byte)*puVar32 >> ((byte)local_68[0] & 0x1f) & ((byte)(uVar30 << 4) | (byte)uVar30)
            ;
            puVar32 = (ushort *)((long)puVar32 + 1);
          } while (puVar32 < puVar49);
        }
        break;
      case 3:
        if (0 < (long)row_info->rowbytes) {
          puVar49 = (ushort *)(row_info->rowbytes + (long)puVar32);
          iVar41 = 0;
          do {
            lVar22 = (long)iVar41;
            iVar41 = iVar41 + 1;
            if ((int)uVar11 <= iVar41) {
              iVar41 = 0;
            }
            *(byte *)puVar32 = (byte)*puVar32 >> (*(byte *)(local_68 + lVar22) & 0x1f);
            puVar32 = (ushort *)((long)puVar32 + 1);
          } while (puVar32 < puVar49);
        }
        break;
      case 7:
        if (0 < (long)row_info->rowbytes) {
          puVar49 = (ushort *)(row_info->rowbytes + (long)puVar32);
          iVar41 = 0;
          do {
            uVar21 = (ushort)(*puVar32 << 8 | *puVar32 >> 8) >>
                     (*(byte *)(local_68 + iVar41) & 0x1f);
            iVar41 = iVar41 + 1;
            if ((int)uVar11 <= iVar41) {
              iVar41 = 0;
            }
            *puVar32 = uVar21 << 8 | uVar21 >> 8;
            puVar32 = puVar32 + 1;
          } while (puVar32 < puVar49);
        }
      }
      uVar30 = png_ptr->transformations;
    }
  }
  if (((uVar30 & 4) != 0) && (bVar9 = row_info->bit_depth, bVar9 < 8)) {
    ppVar24 = png_ptr->row_buf;
    uVar30 = row_info->width;
    uVar17 = (ulong)uVar30;
    if (bVar9 == 4) {
      if (uVar30 != 0) {
        uVar47 = uVar30 * 4 & 4;
        pbVar34 = ppVar24 + (ulong)(uVar30 - 1 >> 1) + 1;
        pbVar16 = ppVar24 + uVar17;
        do {
          *pbVar16 = *pbVar34 >> (sbyte)uVar47 & 0xf;
          pbVar34 = pbVar34 + -(ulong)(uVar47 != 0);
          uVar47 = (uint)(uVar47 == 0) << 2;
          pbVar16 = pbVar16 + -1;
          uVar29 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar29;
        } while (uVar29 != 0);
      }
    }
    else if (bVar9 == 2) {
      if (uVar30 != 0) {
        uVar47 = ~(uVar30 * 2 + 6) & 6;
        pbVar34 = ppVar24 + (ulong)(uVar30 - 1 >> 2) + 1;
        pbVar16 = ppVar24 + uVar17;
        do {
          *pbVar16 = *pbVar34 >> ((byte)uVar47 & 0x1f) & 3;
          bVar51 = uVar47 == 6;
          uVar47 = uVar47 + 2;
          if (bVar51) {
            uVar47 = 0;
          }
          pbVar34 = pbVar34 + -(ulong)bVar51;
          pbVar16 = pbVar16 + -1;
          uVar29 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar29;
        } while (uVar29 != 0);
      }
    }
    else if ((bVar9 == 1) && (uVar30 != 0)) {
      uVar47 = -uVar30 & 7;
      pbVar16 = ppVar24 + (ulong)(uVar30 - 1 >> 3) + 1;
      ppVar24 = ppVar24 + uVar17;
      do {
        *ppVar24 = (*pbVar16 >> (uVar47 & 0x1f) & 1) != 0;
        bVar51 = uVar47 == 7;
        uVar47 = uVar47 + 1;
        if (bVar51) {
          uVar47 = 0;
        }
        pbVar16 = pbVar16 + -(ulong)bVar51;
        ppVar24 = ppVar24 + -1;
        uVar29 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar29;
      } while (uVar29 != 0);
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)(uVar30 * row_info->channels);
  }
  if ((row_info->color_type == '\x03') && (-1 < png_ptr->num_palette_max)) {
    png_do_check_palette_indexes(png_ptr,row_info);
  }
  uVar30 = png_ptr->transformations;
  if ((uVar30 & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if ((uVar30 >> 0x10 & 1) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if (-1 < (short)uVar30) goto LAB_0011715a;
  ppVar24 = png_ptr->row_buf;
  uVar47 = row_info->width;
  uVar17 = (ulong)uVar47;
  cVar39 = (char)png_ptr->flags;
  pVar33 = (png_byte)(png_ptr->filler >> 8);
  pVar13 = (png_byte)png_ptr->filler;
  if (row_info->color_type == '\x02') {
    if (row_info->bit_depth == '\x10') {
      if (cVar39 < '\0') {
        ppVar12 = ppVar24 + uVar17 * 8 + 1;
        if (1 < uVar47) {
          ppVar23 = ppVar24 + uVar17 * 6;
          iVar41 = uVar47 - 1;
          do {
            ppVar12[-1] = pVar13;
            ppVar12[-2] = pVar33;
            ppVar12[-3] = *ppVar23;
            ppVar12[-4] = ppVar23[-1];
            ppVar12[-5] = ppVar23[-2];
            ppVar12[-6] = ppVar23[-3];
            ppVar12[-7] = ppVar23[-4];
            ppVar12[-8] = ppVar23[-5];
            ppVar12 = ppVar12 + -8;
            ppVar23 = ppVar23 + -6;
            iVar41 = iVar41 + -1;
          } while (iVar41 != 0);
        }
        ppVar12[-1] = pVar13;
        ppVar12[-2] = pVar33;
        sVar14 = 3;
        pVar35 = '@';
LAB_00117141:
        pVar40 = '\x04';
      }
      else {
        sVar14 = 3;
        pVar35 = '@';
        pVar40 = '\x04';
        if (uVar47 != 0) {
          ppVar12 = ppVar24 + uVar17 * 8;
          ppVar23 = ppVar24 + uVar17 * 6;
          do {
            *ppVar12 = *ppVar23;
            ppVar12[-1] = ppVar23[-1];
            ppVar12[-2] = ppVar23[-2];
            ppVar12[-3] = ppVar23[-3];
            ppVar12[-4] = ppVar23[-4];
            ppVar12[-5] = ppVar23[-5];
            ppVar12[-6] = pVar13;
            ppVar12[-7] = pVar33;
            ppVar12 = ppVar12 + -8;
            ppVar23 = ppVar23 + -6;
            uVar30 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar30;
          } while (uVar30 != 0);
        }
      }
    }
    else {
      if (row_info->bit_depth != '\b') goto LAB_0011715a;
      if (cVar39 < '\0') {
        ppVar12 = ppVar24 + uVar17 * 4 + 1;
        if (1 < uVar47) {
          ppVar23 = ppVar24 + uVar17 * 3;
          iVar41 = uVar47 - 1;
          do {
            ppVar12[-1] = pVar13;
            ppVar12[-2] = *ppVar23;
            ppVar12[-3] = ppVar23[-1];
            ppVar12[-4] = ppVar23[-2];
            ppVar12 = ppVar12 + -4;
            ppVar23 = ppVar23 + -3;
            iVar41 = iVar41 + -1;
          } while (iVar41 != 0);
        }
        ppVar12[-1] = pVar13;
        sVar14 = 2;
        pVar35 = ' ';
        goto LAB_00117141;
      }
      sVar14 = 2;
      pVar35 = ' ';
      pVar40 = '\x04';
      if (uVar47 != 0) {
        ppVar12 = ppVar24 + uVar17 * 4;
        ppVar23 = ppVar24 + uVar17 * 3;
        do {
          *ppVar12 = *ppVar23;
          ppVar12[-1] = ppVar23[-1];
          ppVar12[-2] = ppVar23[-2];
          ppVar12[-3] = pVar13;
          ppVar12 = ppVar12 + -4;
          ppVar23 = ppVar23 + -3;
          uVar30 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar30;
        } while (uVar30 != 0);
      }
    }
  }
  else {
    if (row_info->color_type != '\0') goto LAB_0011715a;
    if (row_info->bit_depth == '\x10') {
      if (cVar39 < '\0') {
        ppVar12 = ppVar24 + uVar17 * 4 + 1;
        if (1 < uVar47) {
          ppVar23 = ppVar24 + uVar17 * 2;
          iVar41 = uVar47 - 1;
          do {
            ppVar12[-1] = pVar13;
            ppVar12[-2] = pVar33;
            ppVar12[-3] = *ppVar23;
            ppVar12[-4] = ppVar23[-1];
            ppVar12 = ppVar12 + -4;
            ppVar23 = ppVar23 + -2;
            iVar41 = iVar41 + -1;
          } while (iVar41 != 0);
        }
        ppVar12[-1] = pVar13;
        ppVar12[-2] = pVar33;
        sVar14 = 2;
        pVar35 = ' ';
LAB_001170cf:
        pVar40 = '\x02';
      }
      else {
        sVar14 = 2;
        pVar35 = ' ';
        pVar40 = '\x02';
        uVar30 = uVar47;
        while (uVar30 != 0) {
          ppVar24[uVar17 * 4] = ppVar24[uVar17 * 2];
          ppVar24[uVar17 * 4 + -1] = ppVar24[uVar17 * 2 + -1];
          ppVar24[uVar17 * 4 + -2] = pVar13;
          ppVar24[uVar17 * 4 + -3] = pVar33;
          uVar17 = uVar17 - 1;
          uVar30 = (uint)uVar17;
        }
      }
    }
    else {
      if (row_info->bit_depth != '\b') goto LAB_0011715a;
      if (cVar39 < '\0') {
        ppVar12 = ppVar24 + uVar17 * 2 + 1;
        if (1 < uVar47) {
          ppVar23 = ppVar24 + uVar17;
          iVar41 = uVar47 - 1;
          do {
            ppVar12[-1] = pVar13;
            ppVar12[-2] = *ppVar23;
            ppVar12 = ppVar12 + -2;
            ppVar23 = ppVar23 + -1;
            iVar41 = iVar41 + -1;
          } while (iVar41 != 0);
        }
        ppVar12[-1] = pVar13;
        sVar14 = 1;
        pVar35 = '\x10';
        goto LAB_001170cf;
      }
      sVar14 = 1;
      pVar35 = '\x10';
      pVar40 = '\x02';
      uVar30 = uVar47;
      while (uVar30 != 0) {
        ppVar24[uVar17 * 2] = ppVar24[uVar17];
        ppVar24[uVar17 * 2 + -1] = pVar13;
        uVar17 = uVar17 - 1;
        uVar30 = (uint)uVar17;
      }
    }
  }
  row_info->channels = pVar40;
  row_info->pixel_depth = pVar35;
  row_info->rowbytes = (ulong)(uVar47 << sVar14);
  uVar30 = png_ptr->transformations;
LAB_0011715a:
  if ((uVar30 >> 0x11 & 1) != 0) {
    ppVar24 = png_ptr->row_buf;
    pVar10 = row_info->width;
    if (row_info->color_type == '\x04') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          ppVar24 = ppVar24 + row_info->rowbytes;
          do {
            puVar32 = (ushort *)(ppVar24 + -1);
            *puVar32 = *puVar32 << 8 | *puVar32 >> 8;
            ppVar24 = ppVar24 + -2;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        puVar19 = (uint *)(ppVar24 + (row_info->rowbytes - 3));
        do {
          auVar52 = pshuflw(ZEXT416(*puVar19),ZEXT416(*puVar19),0xe1);
          *puVar19 = auVar52._0_4_;
          puVar19 = puVar19 + -1;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
    else if (row_info->color_type == '\x06') {
      if (row_info->bit_depth == '\b') {
        if (pVar10 != 0) {
          puVar19 = (uint *)(ppVar24 + (row_info->rowbytes - 3));
          do {
            *puVar19 = *puVar19 << 8 | *puVar19 >> 0x18;
            puVar19 = puVar19 + -1;
            pVar10 = pVar10 - 1;
          } while (pVar10 != 0);
        }
      }
      else if (pVar10 != 0) {
        puVar20 = (ulong *)(ppVar24 + (row_info->rowbytes - 7));
        do {
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *puVar20;
          auVar52 = pshuflw(auVar52,auVar52,0x93);
          *puVar20 = auVar52._0_8_;
          puVar20 = puVar20 + -1;
          pVar10 = pVar10 - 1;
        } while (pVar10 != 0);
      }
    }
  }
  uVar30 = png_ptr->transformations;
  if ((uVar30 & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
    uVar30 = png_ptr->transformations;
  }
  if ((uVar30 >> 0x14 & 1) != 0) {
    if (png_ptr->read_user_transform_fn != (png_user_transform_ptr)0x0) {
      (*png_ptr->read_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    }
    if (png_ptr->user_transform_depth != '\0') {
      row_info->bit_depth = png_ptr->user_transform_depth;
    }
    pVar13 = png_ptr->user_transform_channels;
    if (pVar13 == '\0') {
      pVar13 = row_info->channels;
    }
    else {
      row_info->channels = pVar13;
    }
    bVar9 = pVar13 * row_info->bit_depth;
    row_info->pixel_depth = bVar9;
    if (bVar9 < 8) {
      uVar17 = (ulong)row_info->width * (ulong)bVar9 + 7 >> 3;
    }
    else {
      uVar17 = (ulong)row_info->width * (ulong)(bVar9 >> 3);
    }
    row_info->rowbytes = uVar17;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_read_transformations");

   if (png_ptr->row_buf == NULL)
   {
      /* Prior to 1.5.4 this output row/pass where the NULL pointer is, but this
       * error is incredibly rare and incredibly easy to debug without this
       * information.
       */
      png_error(png_ptr, "NULL row buffer");
   }

   /* The following is debugging; prior to 1.5.4 the code was never compiled in;
    * in 1.5.4 PNG_FLAG_DETECT_UNINITIALIZED was added and the macro
    * PNG_WARN_UNINITIALIZED_ROW removed.  In 1.6 the new flag is set only for
    * all transformations, however in practice the ROW_INIT always gets done on
    * demand, if necessary.
    */
   if ((png_ptr->flags & PNG_FLAG_DETECT_UNINITIALIZED) != 0 &&
       (png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
   {
      /* Application has failed to call either png_read_start_image() or
       * png_read_update_info() after setting transforms that expand pixels.
       * This check added to libpng-1.2.19 (but not enabled until 1.5.4).
       */
      png_error(png_ptr, "Uninitialized row");
   }

#ifdef PNG_READ_EXPAND_SUPPORTED
   if ((png_ptr->transformations & PNG_EXPAND) != 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_PALETTE)
      {
#ifdef PNG_ARM_NEON_INTRINSICS_AVAILABLE
         if ((png_ptr->num_trans > 0) && (png_ptr->bit_depth == 8))
         {
            /* Allocate space for the decompressed full palette. */
            if (png_ptr->riffled_palette == NULL)
            {
               png_ptr->riffled_palette = png_malloc(png_ptr, 256*4);
               if (png_ptr->riffled_palette == NULL)
                  png_error(png_ptr, "NULL row buffer");
               /* Build the RGBA palette. */
               png_riffle_palette_rgba(png_ptr, row_info);
            }
         }
#endif
         png_do_expand_palette(png_ptr, row_info, png_ptr->row_buf + 1,
            png_ptr->palette, png_ptr->trans_alpha, png_ptr->num_trans);
      }

      else
      {
         if (png_ptr->num_trans != 0 &&
             (png_ptr->transformations & PNG_EXPAND_tRNS) != 0)
            png_do_expand(row_info, png_ptr->row_buf + 1,
                &(png_ptr->trans_color));

         else
            png_do_expand(row_info, png_ptr->row_buf + 1, NULL);
      }
   }
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
   {
      int rgb_error =
          png_do_rgb_to_gray(png_ptr, row_info,
              png_ptr->row_buf + 1);

      if (rgb_error != 0)
      {
         png_ptr->rgb_to_gray_status=1;
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_WARN)
            png_warning(png_ptr, "png_do_rgb_to_gray found nongray pixel");

         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_ERR)
            png_error(png_ptr, "png_do_rgb_to_gray found nongray pixel");
      }
   }
#endif

/* From Andreas Dilger e-mail to png-implement, 26 March 1998:
 *
 *   In most cases, the "simple transparency" should be done prior to doing
 *   gray-to-RGB, or you will have to test 3x as many bytes to check if a
 *   pixel is transparent.  You would also need to make sure that the
 *   transparency information is upgraded to RGB.
 *
 *   To summarize, the current flow is:
 *   - Gray + simple transparency -> compare 1 or 2 gray bytes and composite
 *                                   with background "in place" if transparent,
 *                                   convert to RGB if necessary
 *   - Gray + alpha -> composite with gray background and remove alpha bytes,
 *                                   convert to RGB if necessary
 *
 *   To support RGB backgrounds for gray images we need:
 *   - Gray + simple transparency -> convert to RGB + simple transparency,
 *                                   compare 3 or 6 bytes and composite with
 *                                   background "in place" if transparent
 *                                   (3x compare/pixel compared to doing
 *                                   composite with gray bkgrnd)
 *   - Gray + alpha -> convert to RGB + alpha, composite with background and
 *                                   remove alpha bytes (3x float
 *                                   operations/pixel compared with composite
 *                                   on gray background)
 *
 *  Greg's change will do this.  The reason it wasn't done before is for
 *  performance, as this increases the per-pixel operations.  If we would check
 *  in advance if the background was gray or RGB, and position the gray-to-RGB
 *  transform appropriately, then it would save a lot of work/time.
 */

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* If gray -> RGB, do so now only if background is non-gray; else do later
    * for performance reasons
    */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) == 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
   if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      png_do_compose(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_GAMMA_SUPPORTED
   if ((png_ptr->transformations & PNG_GAMMA) != 0 &&
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
      /* Because RGB_TO_GRAY does the gamma transform. */
      (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0 &&
#endif
#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
      /* Because PNG_COMPOSE does the gamma transform if there is something to
       * do (if there is an alpha channel or transparency.)
       */
       !((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       ((png_ptr->num_trans != 0) ||
       (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)) &&
#endif
      /* Because png_init_read_transformations transforms the palette, unless
       * RGB_TO_GRAY will do the transform.
       */
       (png_ptr->color_type != PNG_COLOR_TYPE_PALETTE))
      png_do_gamma(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   if ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       (row_info->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      png_do_encode_alpha(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_SCALE_16_TO_8_SUPPORTED
   if ((png_ptr->transformations & PNG_SCALE_16_TO_8) != 0)
      png_do_scale_16_to_8(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_STRIP_16_TO_8_SUPPORTED
   /* There is no harm in doing both of these because only one has any effect,
    * by putting the 'scale' option first if the app asks for scale (either by
    * calling the API or in a TRANSFORM flag) this is what happens.
    */
   if ((png_ptr->transformations & PNG_16_TO_8) != 0)
      png_do_chop(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_QUANTIZE_SUPPORTED
   if ((png_ptr->transformations & PNG_QUANTIZE) != 0)
   {
      png_do_quantize(row_info, png_ptr->row_buf + 1,
          png_ptr->palette_lookup, png_ptr->quantize_index);

      if (row_info->rowbytes == 0)
         png_error(png_ptr, "png_do_quantize returned rowbytes=0");
   }
#endif /* READ_QUANTIZE */

#ifdef PNG_READ_EXPAND_16_SUPPORTED
   /* Do the expansion now, after all the arithmetic has been done.  Notice
    * that previous transformations can handle the PNG_EXPAND_16 flag if this
    * is efficient (particularly true in the case of gamma correction, where
    * better accuracy results faster!)
    */
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0)
      png_do_expand_16(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* NOTE: moved here in 1.5.4 (from much later in this list.) */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) != 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_read_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_unshift(row_info, png_ptr->row_buf + 1,
          &(png_ptr->shift));
#endif

#ifdef PNG_READ_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_unpack(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_CHECK_FOR_INVALID_INDEX_SUPPORTED
   /* Added at libpng-1.5.10 */
   if (row_info->color_type == PNG_COLOR_TYPE_PALETTE &&
       png_ptr->num_palette_max >= 0)
      png_do_check_palette_indexes(png_ptr, row_info);
#endif

#ifdef PNG_READ_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_read_filler(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->filler, png_ptr->flags);
#endif

#ifdef PNG_READ_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_read_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_16BIT_SUPPORTED
#ifdef PNG_READ_SWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#endif
#endif

#ifdef PNG_READ_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
   {
      if (png_ptr->read_user_transform_fn != NULL)
         (*(png_ptr->read_user_transform_fn)) /* User read transform function */
             (png_ptr,     /* png_ptr */
             row_info,     /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);    /* start of pixel data for row */
#ifdef PNG_USER_TRANSFORM_PTR_SUPPORTED
      if (png_ptr->user_transform_depth != 0)
         row_info->bit_depth = png_ptr->user_transform_depth;

      if (png_ptr->user_transform_channels != 0)
         row_info->channels = png_ptr->user_transform_channels;
#endif
      row_info->pixel_depth = (png_byte)(row_info->bit_depth *
          row_info->channels);

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_info->width);
   }
#endif
}